

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine_test.c
# Opt level: O3

int test_encode_char(void)

{
  int iVar1;
  char *__s2;
  long lVar2;
  char encoded_char [10];
  undefined4 local_32;
  char local_2e;
  
  __s2 = "x";
  lVar2 = 0;
  do {
    statemachine_encode_char((&DAT_00108d60)[lVar2],(char *)&local_32,10);
    iVar1 = strcmp((char *)&local_32,__s2);
    if (iVar1 != 0) {
      printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
             ,0x14e,&local_32,__s2);
      iVar1 = strcmp((char *)&local_32,__s2);
      if (iVar1 != 0) {
        __assert_fail("!strcmp((encoded_char), (encode_map[i].result))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                      ,0x14e,"int test_encode_char()");
      }
      goto LAB_0010371f;
    }
    __s2 = *(char **)((long)&DAT_00108d78 + lVar2);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  statemachine_encode_char(-1,(char *)&local_32,1);
  if ((char)local_32 == '\0') {
    statemachine_encode_char(-1,(char *)&local_32,2);
    if ((short)local_32 == 0x5c) {
      statemachine_encode_char(-1,(char *)&local_32,3);
      if (local_32._2_1_ == '\0' && (short)local_32 == 0x785c) {
        statemachine_encode_char(-1,(char *)&local_32,4);
        if (local_32 == 0x66785c) {
          statemachine_encode_char(-1,(char *)&local_32,5);
          if (local_2e == '\0' && local_32 == 0x6666785c) {
            return 0;
          }
          printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                 ,0x15e,&local_32,"\\xff");
          if (local_2e != '\0' || local_32 != 0x6666785c) {
            __assert_fail("!strcmp((encoded_char), (\"\\\\xff\"))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                          ,0x15e,"int test_encode_char()");
          }
        }
        else {
          printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                 ,0x15b,&local_32,"\\xf");
          if (local_32 != 0x66785c) {
            __assert_fail("!strcmp((encoded_char), (\"\\\\xf\"))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                          ,0x15b,"int test_encode_char()");
          }
        }
      }
      else {
        printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
               ,0x158,&local_32,"\\x");
        if (local_32._2_1_ != '\0' || (short)local_32 != 0x785c) {
          __assert_fail("!strcmp((encoded_char), (\"\\\\x\"))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                        ,0x158,"int test_encode_char()");
        }
      }
    }
    else {
      printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
             ,0x155,&local_32,"\\");
      if ((short)local_32 != 0x5c) {
        __assert_fail("!strcmp((encoded_char), (\"\\\\\"))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                      ,0x155,"int test_encode_char()");
      }
    }
  }
  else {
    printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x152,&local_32,"");
    if ((char)local_32 != '\0') {
      __assert_fail("!strcmp((encoded_char), (\"\"))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                    ,0x152,"int test_encode_char()");
    }
  }
LAB_0010371f:
  exit(1);
}

Assistant:

int test_encode_char()
{
  char encoded_char[10];
  int i;

  struct {
    char chr;
    const char *result;
  } encode_map[] = {
    { 'x', "x" },
    { '0', "0" },
    { '\n', "\\n" },
    { '\r', "\\r" },
    { '\t', "\\t" },
    { '\\', "\\\\" },
    { '\0', "\\x00" },
    { '\xF0', "\\xf0" },
    { '\0', NULL}  // Terminates when output == NULL
  };

  for (i = 0; encode_map[i].result; i++) {
    statemachine_encode_char(encode_map[i].chr, encoded_char,
                             sizeof(encoded_char) / sizeof(*encoded_char));
    ASSERT_STREQ(encoded_char, encode_map[i].result);
  }

  statemachine_encode_char('\xFF', encoded_char, 1);
  ASSERT_STREQ(encoded_char, "");

  statemachine_encode_char('\xFF', encoded_char, 2);
  ASSERT_STREQ(encoded_char, "\\");

  statemachine_encode_char('\xFF', encoded_char, 3);
  ASSERT_STREQ(encoded_char, "\\x");

  statemachine_encode_char('\xFF', encoded_char, 4);
  ASSERT_STREQ(encoded_char, "\\xf");

  statemachine_encode_char('\xFF', encoded_char, 5);
  ASSERT_STREQ(encoded_char, "\\xff");

  return 0;
}